

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O0

void webfront::http::std::experimental::net::v1::detail::thread_info_base::
     deallocate<std::experimental::net::v1::detail::thread_info_base::default_tag>
               (long *param_1,undefined1 *param_2,ulong param_3)

{
  uchar *mem;
  
  if (((param_3 < 0x3fd) && (param_1 != (long *)0x0)) && (*param_1 == 0)) {
    *param_2 = param_2[param_3];
    *param_1 = (long)param_2;
  }
  else {
    operator_delete(param_2);
  }
  return;
}

Assistant:

static void deallocate(Purpose, thread_info_base* this_thread,
      void* pointer, std::size_t size)
  {
    if (size <= chunk_size * UCHAR_MAX)
    {
      if (this_thread && this_thread->reusable_memory_[Purpose::mem_index] == 0)
      {
        unsigned char* const mem = static_cast<unsigned char*>(pointer);
        mem[0] = mem[size];
        this_thread->reusable_memory_[Purpose::mem_index] = pointer;
        return;
      }
    }

    ::operator delete(pointer);
  }